

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLuint __thiscall gl4cts::EnhancedLayouts::Utils::Type::GetLocations(Type *this)

{
  int local_14;
  GLuint n_loc_per_column;
  Type *this_local;
  
  if ((this->m_n_rows < 3) || (this->m_basic_type != Double)) {
    local_14 = 1;
  }
  else {
    local_14 = 2;
  }
  return local_14 * this->m_n_columns;
}

Assistant:

GLuint Type::GetLocations() const
{
	GLuint n_loc_per_column;

	/* 1 or 2 doubles any for rest */
	if ((2 >= m_n_rows) || (Double != m_basic_type))
	{
		n_loc_per_column = 1;
	}
	else
	{
		/* 3 and 4 doubles */
		n_loc_per_column = 2;
	}

	return n_loc_per_column * m_n_columns;
}